

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O1

void __thiscall NetworkNS::Domain::put_in_primary_box(Domain *this,double *coords,int *pcoeffs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar1 = this->BoxLow[0];
  dVar2 = this->XBoxLen;
  dVar3 = *coords;
  dVar4 = coords[1];
  dVar5 = this->YBoxLen;
  dVar6 = this->BoxLow[1];
  dVar7 = coords[2];
  dVar8 = this->ZBoxLen;
  dVar9 = this->BoxLow[2];
  dVar10 = round((dVar3 - (dVar2 * 0.5 + dVar1)) * this->iXBoxLen);
  *pcoeffs = (int)dVar10;
  dVar5 = round((dVar4 - (dVar5 * 0.5 + dVar6)) * this->iYBoxLen);
  pcoeffs[1] = (int)dVar5;
  dVar6 = round((dVar7 - (dVar8 * 0.5 + dVar9)) * this->iZBoxLen);
  pcoeffs[2] = (int)dVar6;
  *coords = (double)(int)dVar10 * dVar2 + dVar1 + dVar3;
  coords[1] = (double)(int)dVar5 * this->YBoxLen + this->BoxLow[1] + dVar4;
  coords[2] = (double)(int)dVar6 * this->ZBoxLen + this->BoxLow[2] + dVar7;
  return;
}

Assistant:

void Domain::put_in_primary_box(double *coords, int *pcoeffs){
      
      // Calculate the distance from the center of the simulation box.
      double distx = coords[0] - (BoxLow[0] + 0.5*XBoxLen);
      double disty = coords[1] - (BoxLow[1] + 0.5*YBoxLen);
      double distz = coords[2] - (BoxLow[2] + 0.5*ZBoxLen);
      
      // Calculate the periodic continuation coefficients:
      pcoeffs[0] = round(distx * iXBoxLen);
      pcoeffs[1] = round(disty * iYBoxLen);
      pcoeffs[2] = round(distz * iZBoxLen);
      
      coords[0] += (double)pcoeffs[0] * XBoxLen + BoxLow[0];
      coords[1] += (double)pcoeffs[1] * YBoxLen + BoxLow[1];
      coords[2] += (double)pcoeffs[2] * ZBoxLen + BoxLow[2];
      
      return;
   }